

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineBasic.cpp
# Opt level: O3

void anon_unknown.dwarf_10f54f::readFile
               (string *filename,int channelCount,bool bulkRead,bool randomChannels)

{
  float fVar1;
  LineOrder LVar2;
  Compression CVar3;
  PixelType PVar4;
  uint uVar5;
  size_t __n;
  PixelType t;
  ulong __n_00;
  Array2D<void_*> *pAVar6;
  bool bVar7;
  uint uVar8;
  Header *this;
  Box2i *pBVar9;
  Box2i *pBVar10;
  float *pfVar11;
  V2f *pVVar12;
  V2f *pVVar13;
  LineOrder *pLVar14;
  Compression *pCVar15;
  ChannelList *this_00;
  ChannelList *other;
  string *psVar16;
  string *psVar17;
  void *pvVar18;
  void *pvVar19;
  ostream *poVar20;
  void **ppvVar21;
  int iVar22;
  undefined7 in_register_00000009;
  long lVar23;
  long lVar24;
  uint uVar25;
  ulong uVar26;
  char *pcVar27;
  long lVar28;
  void *pvVar29;
  size_t spst;
  undefined1 in_R10B;
  int j_2;
  int j;
  ulong uVar30;
  long lVar31;
  int j_1;
  ulong uVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int iVar38;
  int iVar39;
  ulong local_310;
  Array<Imf_2_5::Array2D<void_*>_> data;
  DeepScanLineInputFile file;
  string str;
  vector<int,_std::allocator<int>_> read_channel;
  DeepFrameBuffer frameBuffer;
  stringstream ss;
  undefined1 local_1e0 [112];
  ios_base local_170 [264];
  DeepSlice local_68;
  
  iVar22 = (int)CONCAT71(in_register_00000009,randomChannels);
  if (iVar22 == 0) {
    pcVar27 = " reading all channels ";
    lVar24 = 0x16;
  }
  else {
    pcVar27 = " reading random channels ";
    lVar24 = 0x19;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar27,lVar24);
  std::ostream::flush();
  Imf_2_5::DeepScanLineInputFile::DeepScanLineInputFile(&file,(filename->_M_dataplus)._M_p,8);
  this = Imf_2_5::DeepScanLineInputFile::header(&file);
  pBVar9 = Imf_2_5::Header::displayWindow(this);
  pBVar10 = Imf_2_5::Header::displayWindow((Header *)(anonymous_namespace)::header);
  iVar38 = -(uint)((pBVar10->min).x == (pBVar9->min).x);
  iVar39 = -(uint)((pBVar10->min).y == (pBVar9->min).y);
  auVar34._4_4_ = iVar38;
  auVar34._0_4_ = iVar38;
  auVar34._8_4_ = iVar39;
  auVar34._12_4_ = iVar39;
  iVar22 = movmskpd(iVar22,auVar34);
  if ((iVar22 != 3) ||
     (iVar38 = -(uint)((pBVar10->max).x == (pBVar9->max).x),
     iVar39 = -(uint)((pBVar10->max).y == (pBVar9->max).y), auVar35._4_4_ = iVar38,
     auVar35._0_4_ = iVar38, auVar35._8_4_ = iVar39, auVar35._12_4_ = iVar39,
     iVar38 = movmskpd((int)pBVar10,auVar35), iVar38 != 3)) {
    __assert_fail("fileHeader.displayWindow() == header.displayWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x10a,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pBVar9 = Imf_2_5::Header::dataWindow(this);
  pBVar10 = Imf_2_5::Header::dataWindow((Header *)(anonymous_namespace)::header);
  iVar38 = -(uint)((pBVar10->min).x == (pBVar9->min).x);
  iVar39 = -(uint)((pBVar10->min).y == (pBVar9->min).y);
  auVar36._4_4_ = iVar38;
  auVar36._0_4_ = iVar38;
  auVar36._8_4_ = iVar39;
  auVar36._12_4_ = iVar39;
  iVar22 = movmskpd(iVar22,auVar36);
  if ((iVar22 != 3) ||
     (iVar22 = -(uint)((pBVar10->max).x == (pBVar9->max).x),
     iVar38 = -(uint)((pBVar10->max).y == (pBVar9->max).y), auVar37._4_4_ = iVar22,
     auVar37._0_4_ = iVar22, auVar37._8_4_ = iVar38, auVar37._12_4_ = iVar38,
     iVar22 = movmskpd((int)pBVar10,auVar37), iVar22 != 3)) {
    __assert_fail("fileHeader.dataWindow() == header.dataWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x10b,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pfVar11 = Imf_2_5::Header::pixelAspectRatio(this);
  fVar33 = *pfVar11;
  pfVar11 = Imf_2_5::Header::pixelAspectRatio((Header *)(anonymous_namespace)::header);
  if ((fVar33 != *pfVar11) || (NAN(fVar33) || NAN(*pfVar11))) {
    __assert_fail("fileHeader.pixelAspectRatio() == header.pixelAspectRatio()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x10c,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pVVar12 = Imf_2_5::Header::screenWindowCenter(this);
  pVVar13 = Imf_2_5::Header::screenWindowCenter((Header *)(anonymous_namespace)::header);
  if ((((pVVar12->x != pVVar13->x) || (NAN(pVVar12->x) || NAN(pVVar13->x))) ||
      (pVVar12->y != pVVar13->y)) || (NAN(pVVar12->y) || NAN(pVVar13->y))) {
    __assert_fail("fileHeader.screenWindowCenter() == header.screenWindowCenter()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x10d,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pfVar11 = Imf_2_5::Header::screenWindowWidth(this);
  fVar33 = *pfVar11;
  pfVar11 = Imf_2_5::Header::screenWindowWidth((Header *)(anonymous_namespace)::header);
  if ((fVar33 != *pfVar11) || (NAN(fVar33) || NAN(*pfVar11))) {
    __assert_fail("fileHeader.screenWindowWidth() == header.screenWindowWidth()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x10e,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pLVar14 = Imf_2_5::Header::lineOrder(this);
  LVar2 = *pLVar14;
  pLVar14 = Imf_2_5::Header::lineOrder((Header *)(anonymous_namespace)::header);
  if (LVar2 != *pLVar14) {
    __assert_fail("fileHeader.lineOrder() == header.lineOrder()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x10f,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pCVar15 = Imf_2_5::Header::compression(this);
  CVar3 = *pCVar15;
  pCVar15 = Imf_2_5::Header::compression((Header *)(anonymous_namespace)::header);
  if (CVar3 != *pCVar15) {
    __assert_fail("fileHeader.compression() == header.compression()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x110,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  this_00 = Imf_2_5::Header::channels(this);
  other = Imf_2_5::Header::channels((Header *)(anonymous_namespace)::header);
  bVar7 = Imf_2_5::ChannelList::operator==(this_00,other);
  if (!bVar7) {
    __assert_fail("fileHeader.channels() == header.channels()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x111,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  psVar16 = Imf_2_5::Header::type_abi_cxx11_(this);
  psVar17 = Imf_2_5::Header::type_abi_cxx11_((Header *)(anonymous_namespace)::header);
  __n = psVar16->_M_string_length;
  if ((__n != psVar17->_M_string_length) ||
     ((__n != 0 &&
      (iVar22 = bcmp((psVar16->_M_dataplus)._M_p,(psVar17->_M_dataplus)._M_p,__n), iVar22 != 0)))) {
    __assert_fail("fileHeader.type() == header.type()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x112,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pvVar18 = operator_new__(0x2e1f4);
  uVar8 = random_int(3);
  uVar30 = (ulong)uVar8;
  uVar25 = channelCount + uVar8;
  Imf_2_5::Array<Imf_2_5::Array2D<void_*>_>::Array(&data,(long)(int)uVar25);
  if (0 < (int)uVar25) {
    lVar24 = 0;
    do {
      pAVar6 = data._data;
      pvVar19 = operator_new__(0x5c3e8);
      pvVar29 = *(void **)((long)&pAVar6->_data + lVar24);
      if (pvVar29 != (void *)0x0) {
        operator_delete__(pvVar29);
      }
      *(undefined8 *)((long)&pAVar6->_sizeX + lVar24) = 0xad;
      *(undefined8 *)((long)&pAVar6->_sizeY + lVar24) = 0x111;
      *(void **)((long)&pAVar6->_data + lVar24) = pvVar19;
      lVar24 = lVar24 + 0x18;
    } while ((ulong)uVar25 * 0x18 != lVar24);
  }
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_2_5::Slice::Slice
            (&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,(bool)in_R10B,
             SUB81(frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0));
  Imf_2_5::Slice::Slice
            ((Slice *)&ss,UINT,
             (char *)((long)pvVar18 +
                     (long)(int)DAT_004a22d4 * -0x444 + (long)(anonymous_namespace)::dataWindow * -4
                     ),4,0x444,1,1,0.0,(bool)in_R10B,(bool)((char)DAT_004a22d4 * 'D'));
  Imf_2_5::DeepFrameBuffer::insertSampleCountSlice(&frameBuffer,(Slice *)&ss);
  __n_00 = (ulong)(uint)channelCount;
  std::vector<int,_std::allocator<int>_>::vector(&read_channel,__n_00,(allocator_type *)&ss);
  if (0 < channelCount) {
    lVar24 = 0x10;
    uVar32 = 0;
    iVar22 = 0;
    do {
      if (randomChannels) {
        iVar38 = random_int(2);
        read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar32] = iVar38;
        if (iVar38 == 1) goto LAB_0014b7d7;
      }
      else {
LAB_0014b7d7:
        PVar4 = *(PixelType *)((anonymous_namespace)::channelTypes + uVar32 * 4);
        t = (uint)(PVar4 != UINT) * 3;
        if (PVar4 == HALF) {
          t = PVar4;
        }
        if (PVar4 == FLOAT) {
          t = PVar4;
        }
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        std::ostream::operator<<(local_1e0,(int)uVar32);
        std::__cxx11::stringbuf::str();
        iVar38 = *(int *)((anonymous_namespace)::channelTypes + uVar32 * 4);
        spst = (ulong)(iVar38 == 0) << 2;
        if (iVar38 == 1) {
          spst = 2;
        }
        if (iVar38 == 2) {
          spst = 4;
        }
        Imf_2_5::DeepSlice::DeepSlice
                  (&local_68,t,
                   (char *)(*(long *)((long)&(data._data)->_sizeX + lVar24) +
                            (long)(anonymous_namespace)::dataWindow * -8 +
                           (long)(int)DAT_004a22d4 * -0x888),8,0x888,spst,1,1,0.0,false,false);
        Imf_2_5::DeepFrameBuffer::insert(&frameBuffer,&str,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)str._M_dataplus._M_p != &str.field_2) {
          operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
        }
        iVar22 = iVar22 + 1;
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        std::ios_base::~ios_base(local_170);
      }
      uVar32 = uVar32 + 1;
      lVar24 = lVar24 + 0x18;
    } while (__n_00 != uVar32);
    if (iVar22 != 0) {
      if (0 < (int)uVar8) {
        lVar24 = __n_00 * 0x18;
        uVar32 = 0;
        do {
          std::__cxx11::stringstream::stringstream((stringstream *)&ss);
          poVar20 = (ostream *)std::ostream::operator<<(local_1e0,(int)uVar32);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,"fill",4);
          std::__cxx11::stringbuf::str();
          Imf_2_5::DeepSlice::DeepSlice
                    (&local_68,FLOAT,
                     (char *)(*(long *)((long)&(data._data)->_data + lVar24) +
                              (long)(anonymous_namespace)::dataWindow * -8 +
                             (long)(int)DAT_004a22d4 * -0x888),8,0x888,4,1,1,0.0,false,false);
          Imf_2_5::DeepFrameBuffer::insert(&frameBuffer,&str,&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)str._M_dataplus._M_p != &str.field_2) {
            operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
          std::ios_base::~ios_base(local_170);
          uVar32 = uVar32 + 1;
          lVar24 = lVar24 + 0x18;
        } while (uVar30 != uVar32);
      }
      Imf_2_5::DeepScanLineInputFile::setFrameBuffer(&file,&frameBuffer);
      if (bulkRead) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bulk ",5);
        std::ostream::flush();
        Imf_2_5::DeepScanLineInputFile::readPixelSampleCounts(&file,DAT_004a22d4,DAT_004a22dc);
        iVar22 = DAT_004a22dc;
        uVar25 = DAT_004a22d4;
        iVar38 = DAT_004a22dc - DAT_004a22d4;
        if ((int)DAT_004a22d4 <= DAT_004a22dc) {
          lVar24 = (anonymous_namespace)::sampleCount._8_8_ * 4;
          lVar28 = 0;
          uVar32 = 0;
          pvVar29 = pvVar18;
          do {
            lVar23 = 0;
            do {
              if (*(int *)((long)pvVar29 + lVar23 * 4) !=
                  *(int *)((anonymous_namespace)::sampleCount._16_8_ + lVar28 + lVar23 * 4)) {
                __assert_fail("localSampleCount[i][j] == sampleCount[i][j]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                              ,0x176,
                              "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                             );
              }
              lVar23 = lVar23 + 1;
            } while (lVar23 != 0x111);
            lVar23 = 0;
            do {
              if (0 < channelCount) {
                lVar31 = 4;
                uVar26 = 0;
                do {
                  if ((!randomChannels) ||
                     (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar26] == 1)) {
                    iVar39 = *(int *)((anonymous_namespace)::channelTypes + uVar26 * 4);
                    if (iVar39 == 0) {
                      pvVar19 = operator_new__((ulong)*(uint *)((long)pvVar18 +
                                                               lVar23 * 4 + uVar32 * 0x444) << 2);
                      *(void **)(*(long *)((long)data._data + lVar31 * 4 + -8) * uVar32 * 8 +
                                 *(long *)((long)&(data._data)->_sizeX + lVar31 * 4) + lVar23 * 8) =
                           pvVar19;
                      iVar39 = *(int *)((anonymous_namespace)::channelTypes + uVar26 * 4);
                    }
                    if (iVar39 == 1) {
                      pvVar19 = operator_new__((ulong)*(uint *)((long)pvVar18 +
                                                               lVar23 * 4 + uVar32 * 0x444) * 2);
                      *(void **)(*(long *)((long)data._data + lVar31 * 4 + -8) * uVar32 * 8 +
                                 *(long *)((long)&(data._data)->_sizeX + lVar31 * 4) + lVar23 * 8) =
                           pvVar19;
                      iVar39 = *(int *)((anonymous_namespace)::channelTypes + uVar26 * 4);
                    }
                    if (iVar39 == 2) {
                      pvVar19 = operator_new__((ulong)*(uint *)((long)pvVar18 +
                                                               lVar23 * 4 + uVar32 * 0x444) << 2);
                      *(void **)(*(long *)((long)data._data + lVar31 * 4 + -8) * uVar32 * 8 +
                                 *(long *)((long)&(data._data)->_sizeX + lVar31 * 4) + lVar23 * 8) =
                           pvVar19;
                    }
                  }
                  uVar26 = uVar26 + 1;
                  lVar31 = lVar31 + 6;
                } while (__n_00 != uVar26);
              }
              if (0 < (int)uVar8) {
                uVar5 = *(uint *)((long)pvVar18 + lVar23 * 4 + uVar32 * 0x444);
                uVar26 = uVar30;
                lVar31 = __n_00 * 0x18 + 0x10;
                do {
                  pvVar19 = operator_new__((ulong)uVar5 << 2);
                  *(void **)(*(long *)((long)data._data + lVar31 + -8) * uVar32 * 8 +
                             *(long *)((long)&(data._data)->_sizeX + lVar31) + lVar23 * 8) = pvVar19
                  ;
                  lVar31 = lVar31 + 0x18;
                  uVar26 = uVar26 - 1;
                } while (uVar26 != 0);
              }
              lVar23 = lVar23 + 1;
            } while (lVar23 != 0x111);
            uVar32 = uVar32 + 1;
            lVar28 = lVar28 + lVar24;
            pvVar29 = (void *)((long)pvVar29 + 0x444);
          } while (uVar32 != iVar38 + 1);
        }
        Imf_2_5::DeepScanLineInputFile::readPixels(&file,uVar25,iVar22);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"per-line ",9);
        std::ostream::flush();
        uVar32 = (ulong)DAT_004a22d4;
        if ((int)DAT_004a22d4 <= DAT_004a22dc) {
          lVar28 = 0;
          lVar24 = 0;
          pvVar29 = pvVar18;
          do {
            iVar22 = (int)uVar32 + (int)lVar24;
            Imf_2_5::DeepScanLineInputFile::readPixelSampleCounts(&file,iVar22);
            lVar23 = 0;
            do {
              if (*(int *)((long)pvVar29 + lVar23 * 4) !=
                  *(int *)((anonymous_namespace)::sampleCount._8_8_ * lVar28 +
                           (anonymous_namespace)::sampleCount._16_8_ + lVar23 * 4)) {
                __assert_fail("localSampleCount[i][j] == sampleCount[i][j]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                              ,0x199,
                              "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                             );
              }
              lVar23 = lVar23 + 1;
            } while (lVar23 != 0x111);
            lVar23 = 0;
            do {
              if (0 < channelCount) {
                lVar31 = 4;
                uVar32 = 0;
                do {
                  if ((!randomChannels) ||
                     (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar32] == 1)) {
                    iVar38 = *(int *)((anonymous_namespace)::channelTypes + uVar32 * 4);
                    if (iVar38 == 0) {
                      pvVar19 = operator_new__((ulong)*(uint *)((long)pvVar18 +
                                                               lVar23 * 4 + lVar24 * 0x444) << 2);
                      *(void **)(*(long *)((long)data._data + lVar31 * 4 + -8) * lVar24 * 8 +
                                 *(long *)((long)&(data._data)->_sizeX + lVar31 * 4) + lVar23 * 8) =
                           pvVar19;
                      iVar38 = *(int *)((anonymous_namespace)::channelTypes + uVar32 * 4);
                    }
                    if (iVar38 == 1) {
                      pvVar19 = operator_new__((ulong)*(uint *)((long)pvVar18 +
                                                               lVar23 * 4 + lVar24 * 0x444) * 2);
                      *(void **)(*(long *)((long)data._data + lVar31 * 4 + -8) * lVar24 * 8 +
                                 *(long *)((long)&(data._data)->_sizeX + lVar31 * 4) + lVar23 * 8) =
                           pvVar19;
                      iVar38 = *(int *)((anonymous_namespace)::channelTypes + uVar32 * 4);
                    }
                    if (iVar38 == 2) {
                      pvVar19 = operator_new__((ulong)*(uint *)((long)pvVar18 +
                                                               lVar23 * 4 + lVar24 * 0x444) << 2);
                      *(void **)(*(long *)((long)data._data + lVar31 * 4 + -8) * lVar24 * 8 +
                                 *(long *)((long)&(data._data)->_sizeX + lVar31 * 4) + lVar23 * 8) =
                           pvVar19;
                    }
                  }
                  uVar32 = uVar32 + 1;
                  lVar31 = lVar31 + 6;
                } while (__n_00 != uVar32);
              }
              if (0 < (int)uVar8) {
                uVar25 = *(uint *)((long)pvVar18 + lVar23 * 4 + lVar24 * 0x444);
                lVar31 = __n_00 * 0x18 + 0x10;
                uVar32 = uVar30;
                do {
                  pvVar19 = operator_new__((ulong)uVar25 << 2);
                  *(void **)(*(long *)((long)data._data + lVar31 + -8) * lVar24 * 8 +
                             *(long *)((long)&(data._data)->_sizeX + lVar31) + lVar23 * 8) = pvVar19
                  ;
                  lVar31 = lVar31 + 0x18;
                  uVar32 = uVar32 - 1;
                } while (uVar32 != 0);
              }
              lVar23 = lVar23 + 1;
            } while (lVar23 != 0x111);
            Imf_2_5::DeepScanLineInputFile::readPixels(&file,iVar22);
            uVar32 = (ulong)(int)DAT_004a22d4;
            lVar28 = lVar28 + 4;
            pvVar29 = (void *)((long)pvVar29 + 0x444);
            bVar7 = lVar24 < (long)((long)DAT_004a22dc - uVar32);
            lVar24 = lVar24 + 1;
          } while (bVar7);
        }
      }
      lVar24 = 0;
      do {
        iVar22 = (int)lVar24;
        lVar28 = 0;
        do {
          if (0 < channelCount) {
            iVar38 = (int)lVar28;
            uVar25 = (uint)(iVar22 * 0x111 + iVar38) % 0x801;
            fVar33 = (float)uVar25;
            local_310 = 0;
            do {
              if (((!randomChannels) ||
                  (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[local_310] == 1)) &&
                 (*(int *)((anonymous_namespace)::sampleCount._8_8_ * lVar24 * 4 +
                           (anonymous_namespace)::sampleCount._16_8_ + lVar28 * 4) != 0)) {
                uVar32 = 0;
                do {
                  iVar39 = *(int *)((anonymous_namespace)::channelTypes + local_310 * 4);
                  if (iVar39 == 0) {
                    pvVar29 = data._data[local_310]._data
                              [data._data[local_310]._sizeY * lVar24 + lVar28];
                    if (*(uint *)((long)pvVar29 + uVar32 * 4) != uVar25) {
                      poVar20 = (ostream *)std::ostream::operator<<(&std::cout,iVar38);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
                      poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar22);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar20," error, should be ",0x12);
                      poVar20 = (ostream *)std::ostream::operator<<(poVar20,uVar25);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar20,", is ",5);
                      poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) +
                                      (char)poVar20);
                      std::ostream::put((char)poVar20);
                      std::ostream::flush();
                      std::ostream::flush();
                      if (*(uint *)((long)pvVar29 + uVar32 * 4) != uVar25) {
                        __assert_fail("value[l] == static_cast<unsigned int>(i * width + j) % 2049",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                                      ,0x1c3,
                                      "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                                     );
                      }
                    }
                    iVar39 = *(int *)((anonymous_namespace)::channelTypes + local_310 * 4);
                  }
                  if (iVar39 == 1) {
                    ppvVar21 = data._data[local_310]._data;
                    lVar23 = data._data[local_310]._sizeY * lVar24;
                    pvVar29 = ppvVar21[lVar23 + lVar28];
                    if ((half::_toFloat[*(ushort *)((long)pvVar29 + uVar32 * 2)].f != fVar33) ||
                       (NAN(half::_toFloat[*(ushort *)((long)pvVar29 + uVar32 * 2)].f) ||
                        NAN(fVar33))) {
                      poVar20 = (ostream *)std::ostream::operator<<(&std::cout,iVar38);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
                      poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar22);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar20," error, should be ",0x12);
                      poVar20 = (ostream *)std::ostream::operator<<(poVar20,uVar25);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar20,", is ",5);
                      poVar20 = operator<<(poVar20,(half)*(unsigned_short *)
                                                          ((long)pvVar29 + uVar32 * 2));
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) +
                                      (char)poVar20);
                      std::ostream::put((char)poVar20);
                      std::ostream::flush();
                      std::ostream::flush();
                      ppvVar21 = data._data[local_310]._data;
                      lVar23 = data._data[local_310]._sizeY * lVar24;
                    }
                    if ((half::_toFloat[*(ushort *)((long)ppvVar21[lVar23 + lVar28] + uVar32 * 2)].f
                         != fVar33) ||
                       (NAN(half::_toFloat
                            [*(ushort *)((long)ppvVar21[lVar23 + lVar28] + uVar32 * 2)].f) ||
                        NAN(fVar33))) {
                      __assert_fail("((half*)(data[k][i][j]))[l] == (i * width + j) % 2049",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                                    ,0x1cc,
                                    "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                                   );
                    }
                    iVar39 = *(int *)((anonymous_namespace)::channelTypes + local_310 * 4);
                  }
                  if (iVar39 == 2) {
                    ppvVar21 = data._data[local_310]._data;
                    lVar23 = data._data[local_310]._sizeY * lVar24;
                    pvVar29 = ppvVar21[lVar23 + lVar28];
                    fVar1 = *(float *)((long)pvVar29 + uVar32 * 4);
                    if ((fVar1 != fVar33) || (NAN(fVar1) || NAN(fVar33))) {
                      poVar20 = (ostream *)std::ostream::operator<<(&std::cout,iVar38);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
                      poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar22);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar20," error, should be ",0x12);
                      poVar20 = (ostream *)std::ostream::operator<<(poVar20,uVar25);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar20,", is ",5);
                      poVar20 = std::ostream::_M_insert<double>
                                          ((double)*(float *)((long)pvVar29 + uVar32 * 4));
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) +
                                      (char)poVar20);
                      std::ostream::put((char)poVar20);
                      std::ostream::flush();
                      std::ostream::flush();
                      ppvVar21 = data._data[local_310]._data;
                      lVar23 = data._data[local_310]._sizeY * lVar24;
                    }
                    fVar1 = *(float *)((long)ppvVar21[lVar23 + lVar28] + uVar32 * 4);
                    if ((fVar1 != fVar33) || (NAN(fVar1) || NAN(fVar33))) {
                      __assert_fail("((float*)(data[k][i][j]))[l] == (i * width + j) % 2049",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                                    ,0x1d5,
                                    "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                                   );
                    }
                  }
                  uVar32 = uVar32 + 1;
                } while (uVar32 < *(uint *)((anonymous_namespace)::sampleCount._8_8_ * lVar24 * 4 +
                                            (anonymous_namespace)::sampleCount._16_8_ + lVar28 * 4))
                ;
              }
              local_310 = local_310 + 1;
            } while (local_310 != __n_00);
          }
          lVar28 = lVar28 + 1;
        } while (lVar28 != 0x111);
        lVar24 = lVar24 + 1;
      } while (lVar24 != 0xad);
      lVar24 = 0;
      do {
        lVar28 = 0;
        do {
          if (0 < channelCount) {
            lVar23 = 4;
            uVar32 = 0;
            do {
              if ((!randomChannels) ||
                 (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar32] == 1)) {
                iVar22 = *(int *)((anonymous_namespace)::channelTypes + uVar32 * 4);
                if (iVar22 == 0) {
                  pvVar29 = *(void **)(*(long *)((long)data._data + lVar23 * 4 + -8) * lVar24 * 8 +
                                       *(long *)((long)&(data._data)->_sizeX + lVar23 * 4) +
                                      lVar28 * 8);
                  if (pvVar29 == (void *)0x0) goto LAB_0014c4be;
                  operator_delete__(pvVar29);
                  iVar22 = *(int *)((anonymous_namespace)::channelTypes + uVar32 * 4);
                }
                if (iVar22 == 1) {
                  pvVar29 = *(void **)(*(long *)((long)data._data + lVar23 * 4 + -8) * lVar24 * 8 +
                                       *(long *)((long)&(data._data)->_sizeX + lVar23 * 4) +
                                      lVar28 * 8);
                  if (pvVar29 == (void *)0x0) goto LAB_0014c4be;
                  operator_delete__(pvVar29);
                  iVar22 = *(int *)((anonymous_namespace)::channelTypes + uVar32 * 4);
                }
                if ((iVar22 == 2) &&
                   (pvVar29 = *(void **)(*(long *)((long)data._data + lVar23 * 4 + -8) * lVar24 * 8
                                         + *(long *)((long)&(data._data)->_sizeX + lVar23 * 4) +
                                        lVar28 * 8), pvVar29 != (void *)0x0)) {
                  operator_delete__(pvVar29);
                }
              }
LAB_0014c4be:
              uVar32 = uVar32 + 1;
              lVar23 = lVar23 + 6;
            } while (__n_00 != uVar32);
          }
          lVar23 = __n_00 * 0x18 + 0x10;
          uVar32 = uVar30;
          if (0 < (int)uVar8) {
            do {
              pvVar29 = *(void **)(*(long *)((long)data._data + lVar23 + -8) * lVar24 * 8 +
                                   *(long *)((long)&(data._data)->_sizeX + lVar23) + lVar28 * 8);
              if (pvVar29 != (void *)0x0) {
                operator_delete__(pvVar29);
              }
              lVar23 = lVar23 + 0x18;
              uVar32 = uVar32 - 1;
            } while (uVar32 != 0);
          }
          lVar28 = lVar28 + 1;
        } while (lVar28 != 0x111);
        lVar24 = lVar24 + 1;
      } while (lVar24 != 0xad);
      goto LAB_0014bcf7;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"skipping ",9);
  std::ostream::flush();
LAB_0014bcf7:
  if (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
               *)&frameBuffer);
  Imf_2_5::Array<Imf_2_5::Array2D<void_*>_>::~Array(&data);
  operator_delete__(pvVar18);
  Imf_2_5::DeepScanLineInputFile::~DeepScanLineInputFile(&file);
  return;
}

Assistant:

void readFile (const std::string & filename,
               int channelCount,
               bool bulkRead,
               bool randomChannels)
{
    if(randomChannels)
    {
      cout << " reading random channels " << flush;
    }
    else
    {
      cout << " reading all channels " << flush;
    }
    
    DeepScanLineInputFile file(filename.c_str(), 8);

    const Header& fileHeader = file.header();
    assert (fileHeader.displayWindow() == header.displayWindow());
    assert (fileHeader.dataWindow() == header.dataWindow());
    assert (fileHeader.pixelAspectRatio() == header.pixelAspectRatio());
    assert (fileHeader.screenWindowCenter() == header.screenWindowCenter());
    assert (fileHeader.screenWindowWidth() == header.screenWindowWidth());
    assert (fileHeader.lineOrder() == header.lineOrder());
    assert (fileHeader.compression() == header.compression());
    assert (fileHeader.channels() == header.channels());
    assert (fileHeader.type() == header.type());

    Array2D<unsigned int> localSampleCount;
    localSampleCount.resizeErase(height, width);
    
        
    // also test filling channels. Generate up to 2 extra channels
    int fillChannels=random_int(3);
    
    Array<Array2D< void* > > data(channelCount+fillChannels);
    for (int i = 0; i < channelCount+fillChannels; i++)
        data[i].resizeErase(height, width);

    DeepFrameBuffer frameBuffer;

    frameBuffer.insertSampleCountSlice (Slice (IMF::UINT,                    // type // 7
                                        (char *) (&localSampleCount[0][0]
                                                  - dataWindow.min.x
                                                  - dataWindow.min.y * width),               // base // 8)
                                        sizeof (unsigned int) * 1,          // xStride// 9
                                        sizeof (unsigned int) * width));    // yStride// 10

    vector<int> read_channel(channelCount);
    
    
    int channels_added=0;
    
    for (int i = 0; i < channelCount; i++)
    {
        if(randomChannels)
        {
	     read_channel[i] = random_int(2);
	     
        }
        if(!randomChannels || read_channel[i]==1)
	{
            PixelType type = NUM_PIXELTYPES;
            if (channelTypes[i] == 0)
                type = IMF::UINT;
            if (channelTypes[i] == 1)
                type = IMF::HALF;
            if (channelTypes[i] == 2)
                type = IMF::FLOAT;

            stringstream ss;
            ss << i;
            string str = ss.str();

            int sampleSize = 0;
            if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
            if (channelTypes[i] == 1) sampleSize = sizeof (half);
            if (channelTypes[i] == 2) sampleSize = sizeof (float);

            int pointerSize = sizeof (char *);

            frameBuffer.insert (str,                            // name // 6
                                DeepSlice (type,                    // type // 7
                                (char *) (&data[i][0][0]
                                          - dataWindow.min.x
                                          - dataWindow.min.y * width),               // base // 8)
                                pointerSize * 1,          // xStride// 9
                                pointerSize * width,      // yStride// 10
                                sampleSize));             // sampleStride
	    channels_added++;
        }
    }
    
    
    if(channels_added==0)
    {
      cout << "skipping " <<flush;
      return;
    }
    for(int i = 0 ; i < fillChannels ; ++i )
    { 
            PixelType type  = IMF::FLOAT;
            int sampleSize = sizeof(float);            
            int pointerSize = sizeof (char *);
            stringstream ss;
            // generate channel names that aren't in file but (might) interleave with existing file
            ss << i << "fill";
            string str = ss.str();
               frameBuffer.insert (str,                            // name // 6
                                DeepSlice (type,                    // type // 7
                                (char *) (&data[i+channelCount][0][0]
                                          - dataWindow.min.x
                                          - dataWindow.min.y * width),               // base // 8)
                                pointerSize * 1,          // xStride// 9
                                pointerSize * width,      // yStride// 10
                                sampleSize));             // sampleStride
    }
    file.setFrameBuffer(frameBuffer);

    if (bulkRead)
    {
        cout << "bulk " << flush;
        file.readPixelSampleCounts(dataWindow.min.y, dataWindow.max.y);
        for (int i = 0; i < dataWindow.max.y - dataWindow.min.y + 1; i++)
        {
            for (int j = 0; j < width; j++)
                assert(localSampleCount[i][j] == sampleCount[i][j]);

            for (int j = 0; j < width; j++)
            {
                for (int k = 0; k < channelCount; k++)
                {
                    if(!randomChannels || read_channel[k]==1)
                    {
                                if (channelTypes[k] == 0)
                                    data[k][i][j] = new unsigned int[localSampleCount[i][j]];
                                if (channelTypes[k] == 1)
                                    data[k][i][j] = new half[localSampleCount[i][j]];
                                if (channelTypes[k] == 2)
                                    data[k][i][j] = new float[localSampleCount[i][j]];
                    }
                }
                for( int f = 0 ; f < fillChannels ; ++f )
                {
                       data[f+channelCount][i][j] = new float[localSampleCount[i][j]];
                }
            }
        }
        
        file.readPixels(dataWindow.min.y, dataWindow.max.y);
    }
    
    else
    {
        cout << "per-line " << flush;
        for (int i = 0; i < dataWindow.max.y - dataWindow.min.y + 1; i++)
        {
            int y = i + dataWindow.min.y;
            file.readPixelSampleCounts(y);

            for (int j = 0; j < width; j++)
                assert(localSampleCount[i][j] == sampleCount[i][j]);

            for (int j = 0; j < width; j++)
            {
                for (int k = 0; k < channelCount; k++)
                {
                    if( !randomChannels || read_channel[k]==1)
                    {
                                if (channelTypes[k] == 0)
                                    data[k][i][j] = new unsigned int[localSampleCount[i][j]];
                                if (channelTypes[k] == 1)
                                    data[k][i][j] = new half[localSampleCount[i][j]];
                                if (channelTypes[k] == 2)
                                    data[k][i][j] = new float[localSampleCount[i][j]];
                    }
                }
                for( int f = 0 ; f < fillChannels ; ++f )
                {
                       data[f+channelCount][i][j] = new float[localSampleCount[i][j]];
                }
            }

            file.readPixels(y);
	    
        }
    }

    for (int i = 0; i < height; i++)
        for (int j = 0; j < width; j++)
            for (int k = 0; k < channelCount; k++)
            {
                if( !randomChannels || read_channel[k]==1 )
                {
                    for (unsigned int l = 0; l < sampleCount[i][j]; l++)
                    {
                        if (channelTypes[k] == 0)
                        {
                            unsigned int* value = (unsigned int*)(data[k][i][j]);
                            if (value[l] != static_cast<unsigned int>(i * width + j) % 2049)
                                cout << j << ", " << i << " error, should be "
                                     << (i * width + j) % 2049 << ", is " << value[l]
                                     << endl << flush;
                            assert (value[l] == static_cast<unsigned int>(i * width + j) % 2049);
                        }
                        if (channelTypes[k] == 1)
                        {
                            half* value = (half*)(data[k][i][j]);
                            if (value[l] != (i * width + j) % 2049)
                                cout << j << ", " << i << " error, should be "
                                     << (i * width + j) % 2049 << ", is " << value[l]
                                     << endl << flush;
                            assert (((half*)(data[k][i][j]))[l] == (i * width + j) % 2049);
                        }
                        if (channelTypes[k] == 2)
                        {
                            float* value = (float*)(data[k][i][j]);
                            if (value[l] != (i * width + j) % 2049)
                                cout << j << ", " << i << " error, should be "
                                     << (i * width + j) % 2049 << ", is " << value[l]
                                     << endl << flush;
                            assert (((float*)(data[k][i][j]))[l] == (i * width + j) % 2049);
                        }
                    }
                }
            }

    for (int i = 0; i < height; i++)
        for (int j = 0; j < width; j++)
        {
            for (int k = 0; k < channelCount; k++)
            {
                if( !randomChannels || read_channel[k]==1 )
                {
                    if (channelTypes[k] == 0)
                        delete[] (unsigned int*) data[k][i][j];
                    if (channelTypes[k] == 1)
                        delete[] (half*) data[k][i][j];
                    if (channelTypes[k] == 2)
                        delete[] (float*) data[k][i][j];
                }
            }
            for( int f = 0 ; f < fillChannels ; ++f )
            {
                 delete[] (float*) data[f+channelCount][i][j];
            }
       }
}